

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O0

uint32_t A64NamedImmMapper_fromString(A64NamedImmMapper *N,char *Name,_Bool *Valid)

{
  _Bool _Var1;
  undefined1 *in_RDX;
  char *in_RSI;
  long *in_RDI;
  uint i;
  uint local_24;
  
  local_24 = 0;
  while( true ) {
    if ((ulong)in_RDI[1] <= (ulong)local_24) {
      *in_RDX = 0;
      return 0xffffffff;
    }
    _Var1 = compare_lower_str((char *)in_RDI,in_RSI);
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  *in_RDX = 1;
  return *(uint32_t *)(*in_RDI + (ulong)local_24 * 0x10 + 8);
}

Assistant:

uint32_t A64NamedImmMapper_fromString(const A64NamedImmMapper *N, char *Name, bool *Valid)
{
	unsigned i;
	for (i = 0; i < N->NumPairs; ++i) {
		if (compare_lower_str(N->Pairs[i].Name, Name)) {
			*Valid = true;
			return N->Pairs[i].Value;
		}
	}

	*Valid = false;
	return (uint32_t)-1;
}